

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall
duckdb::ClientContext::Append
          (ClientContext *this,TableDescription *description,ColumnDataCollection *collection,
          optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> column_ids)

{
  optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> column_ids_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  column_ids_local = column_ids;
  local_38._M_unused._M_object = operator_new(0x20);
  *(ClientContext **)local_38._M_unused._0_8_ = this;
  *(TableDescription **)((long)local_38._M_unused._0_8_ + 8) = description;
  *(ColumnDataCollection **)((long)local_38._M_unused._0_8_ + 0x10) = collection;
  *(optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> **)
   ((long)local_38._M_unused._0_8_ + 0x18) = &column_ids_local;
  pcStack_20 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1201:27)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/client_context.cpp:1201:27)>
             ::_M_manager;
  RunFunctionInTransaction(this,(function<void_()> *)&local_38,true);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void ClientContext::Append(TableDescription &description, ColumnDataCollection &collection,
                           optional_ptr<const vector<LogicalIndex>> column_ids) {

	RunFunctionInTransaction([&]() {
		auto &table_entry =
		    Catalog::GetEntry<TableCatalogEntry>(*this, description.database, description.schema, description.table);
		// verify that the table columns and types match up
		if (description.PhysicalColumnCount() != table_entry.GetColumns().PhysicalColumnCount()) {
			throw InvalidInputException("Failed to append: table entry has different number of columns!");
		}
		idx_t table_entry_col_idx = 0;
		for (idx_t i = 0; i < description.columns.size(); i++) {
			auto &column = description.columns[i];
			if (column.Generated()) {
				continue;
			}
			if (column.Type() != table_entry.GetColumns().GetColumn(PhysicalIndex(table_entry_col_idx)).Type()) {
				throw InvalidInputException("Failed to append: table entry has different number of columns!");
			}
			table_entry_col_idx++;
		}
		auto binder = Binder::CreateBinder(*this);
		auto bound_constraints = binder->BindConstraints(table_entry);
		MetaTransaction::Get(*this).ModifyDatabase(table_entry.ParentCatalog().GetAttached());
		table_entry.GetStorage().LocalAppend(table_entry, *this, collection, bound_constraints, column_ids);
	});
}